

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLoader.c
# Opt level: O0

DATA_LOADER * FileLoader_Init(char *fileName)

{
  void *context;
  char *pcVar1;
  FILE_LOADER *fLoader;
  DATA_LOADER *dLoader;
  char *fileName_local;
  
  fileName_local = (char *)calloc(1,0x28);
  if ((DATA_LOADER *)fileName_local == (DATA_LOADER *)0x0) {
    fileName_local = (char *)0x0;
  }
  else {
    context = calloc(1,0x40);
    if (context == (void *)0x0) {
      free(fileName_local);
      fileName_local = (char *)0x0;
    }
    else {
      pcVar1 = strdup(fileName);
      *(char **)((long)context + 0x10) = pcVar1;
      DataLoader_Setup((DATA_LOADER *)fileName_local,&fileLoader,context);
    }
  }
  return (DATA_LOADER *)fileName_local;
}

Assistant:

DATA_LOADER *FileLoader_Init(const char *fileName)
{
	DATA_LOADER *dLoader;
	FILE_LOADER *fLoader;

	dLoader = (DATA_LOADER *)calloc(1, sizeof(DATA_LOADER));
	if(dLoader == NULL) return NULL;

	fLoader = (FILE_LOADER *)calloc(1, sizeof(FILE_LOADER));
	if(fLoader == NULL)
	{
		free(dLoader);
		return NULL;
	}

	fLoader->fileName = strdup(fileName);

	DataLoader_Setup(dLoader,&fileLoader,fLoader);

	return dLoader;
}